

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_bindless_texture(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_bindless_texture != 0) {
    glad_glGetTextureHandleNV = (PFNGLGETTEXTUREHANDLENVPROC)(*load)("glGetTextureHandleNV");
    glad_glGetTextureSamplerHandleNV =
         (PFNGLGETTEXTURESAMPLERHANDLENVPROC)(*load)("glGetTextureSamplerHandleNV");
    glad_glMakeTextureHandleResidentNV =
         (PFNGLMAKETEXTUREHANDLERESIDENTNVPROC)(*load)("glMakeTextureHandleResidentNV");
    glad_glMakeTextureHandleNonResidentNV =
         (PFNGLMAKETEXTUREHANDLENONRESIDENTNVPROC)(*load)("glMakeTextureHandleNonResidentNV");
    glad_glGetImageHandleNV = (PFNGLGETIMAGEHANDLENVPROC)(*load)("glGetImageHandleNV");
    glad_glMakeImageHandleResidentNV =
         (PFNGLMAKEIMAGEHANDLERESIDENTNVPROC)(*load)("glMakeImageHandleResidentNV");
    glad_glMakeImageHandleNonResidentNV =
         (PFNGLMAKEIMAGEHANDLENONRESIDENTNVPROC)(*load)("glMakeImageHandleNonResidentNV");
    glad_glUniformHandleui64NV = (PFNGLUNIFORMHANDLEUI64NVPROC)(*load)("glUniformHandleui64NV");
    glad_glUniformHandleui64vNV = (PFNGLUNIFORMHANDLEUI64VNVPROC)(*load)("glUniformHandleui64vNV");
    glad_glProgramUniformHandleui64NV =
         (PFNGLPROGRAMUNIFORMHANDLEUI64NVPROC)(*load)("glProgramUniformHandleui64NV");
    glad_glProgramUniformHandleui64vNV =
         (PFNGLPROGRAMUNIFORMHANDLEUI64VNVPROC)(*load)("glProgramUniformHandleui64vNV");
    glad_glIsTextureHandleResidentNV =
         (PFNGLISTEXTUREHANDLERESIDENTNVPROC)(*load)("glIsTextureHandleResidentNV");
    glad_glIsImageHandleResidentNV =
         (PFNGLISIMAGEHANDLERESIDENTNVPROC)(*load)("glIsImageHandleResidentNV");
  }
  return;
}

Assistant:

static void load_GL_NV_bindless_texture(GLADloadproc load) {
	if(!GLAD_GL_NV_bindless_texture) return;
	glad_glGetTextureHandleNV = (PFNGLGETTEXTUREHANDLENVPROC)load("glGetTextureHandleNV");
	glad_glGetTextureSamplerHandleNV = (PFNGLGETTEXTURESAMPLERHANDLENVPROC)load("glGetTextureSamplerHandleNV");
	glad_glMakeTextureHandleResidentNV = (PFNGLMAKETEXTUREHANDLERESIDENTNVPROC)load("glMakeTextureHandleResidentNV");
	glad_glMakeTextureHandleNonResidentNV = (PFNGLMAKETEXTUREHANDLENONRESIDENTNVPROC)load("glMakeTextureHandleNonResidentNV");
	glad_glGetImageHandleNV = (PFNGLGETIMAGEHANDLENVPROC)load("glGetImageHandleNV");
	glad_glMakeImageHandleResidentNV = (PFNGLMAKEIMAGEHANDLERESIDENTNVPROC)load("glMakeImageHandleResidentNV");
	glad_glMakeImageHandleNonResidentNV = (PFNGLMAKEIMAGEHANDLENONRESIDENTNVPROC)load("glMakeImageHandleNonResidentNV");
	glad_glUniformHandleui64NV = (PFNGLUNIFORMHANDLEUI64NVPROC)load("glUniformHandleui64NV");
	glad_glUniformHandleui64vNV = (PFNGLUNIFORMHANDLEUI64VNVPROC)load("glUniformHandleui64vNV");
	glad_glProgramUniformHandleui64NV = (PFNGLPROGRAMUNIFORMHANDLEUI64NVPROC)load("glProgramUniformHandleui64NV");
	glad_glProgramUniformHandleui64vNV = (PFNGLPROGRAMUNIFORMHANDLEUI64VNVPROC)load("glProgramUniformHandleui64vNV");
	glad_glIsTextureHandleResidentNV = (PFNGLISTEXTUREHANDLERESIDENTNVPROC)load("glIsTextureHandleResidentNV");
	glad_glIsImageHandleResidentNV = (PFNGLISIMAGEHANDLERESIDENTNVPROC)load("glIsImageHandleResidentNV");
}